

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

void __thiscall Character::ShowBoard(Character *this,Board *board)

{
  double dVar1;
  World *pWVar2;
  size_t sVar3;
  long lVar4;
  unsigned_short *puVar5;
  bool bVar6;
  __type _Var7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  mapped_type *pmVar12;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  list<Board_Post_*,_std::allocator<Board_Post_*>_> *plVar13;
  _List_node_base *p_Var14;
  int iVar15;
  double dVar16;
  string author_extra;
  string subject_extra;
  PacketBuilder builder;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  if (board == (Board *)0x0) {
    board = this->board;
  }
  pWVar2 = this->world;
  std::__cxx11::string::string((string *)&builder,"BoardDatePosts",(allocator *)&author_extra);
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,(key_type *)&builder);
  bVar6 = util::variant::GetBool(pmVar12);
  std::__cxx11::string::~string((string *)&builder);
  sVar3 = (board->posts).super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
          _M_node._M_size;
  pWVar2 = this->world;
  std::__cxx11::string::string
            ((string *)&author_extra,"BoardMaxSubjectLength",(allocator *)&subject_extra);
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,&author_extra);
  iVar8 = util::variant::GetInt(pmVar12);
  iVar15 = iVar8 + 0x22;
  if (!bVar6) {
    iVar15 = iVar8 + 0x11;
  }
  PacketBuilder::PacketBuilder(&builder,PACKET_BOARD,PACKET_OPEN,sVar3 * (long)iVar15 + 2);
  std::__cxx11::string::~string((string *)&author_extra);
  PacketBuilder::AddChar(&builder,(char)board->id + '\x01');
  PacketBuilder::AddChar
            (&builder,(uchar)(board->posts).
                             super__List_base<Board_Post_*,_std::allocator<Board_Post_*>_>._M_impl.
                             _M_node._M_size);
  plVar13 = &board->posts;
  iVar15 = 0;
  iVar8 = 0;
  p_Var14 = (_List_node_base *)plVar13;
  while( true ) {
    p_Var14 = (((_List_base<Board_Post_*,_std::allocator<Board_Post_*>_> *)&p_Var14->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var14 == (_List_node_base *)plVar13) break;
    lVar4 = (long)p_Var14[1]._M_next;
    (*(this->player->character->super_Command_Source)._vptr_Command_Source[2])(&author_extra);
    _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (lVar4 + 8),&author_extra);
    std::__cxx11::string::~string((string *)&author_extra);
    if (_Var7) {
      dVar1 = *(double *)(lVar4 + 0x70);
      pWVar2 = this->world;
      std::__cxx11::string::string
                ((string *)&author_extra,"BoardRecentPostTime",(allocator *)&subject_extra);
      pmVar12 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&pWVar2->config,&author_extra);
      iVar9 = util::variant::GetInt(pmVar12);
      dVar16 = Timer::GetTime();
      iVar8 = iVar8 + 1;
      std::__cxx11::string::~string((string *)&author_extra);
      if (dVar16 < dVar1 + (double)iVar9) {
        iVar15 = iVar15 + 1;
      }
    }
  }
  pWVar2 = this->world;
  std::__cxx11::string::string((string *)&author_extra,"BoardMaxUserPosts",(allocator *)&local_70);
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,&author_extra);
  iVar10 = util::variant::GetInt(pmVar12);
  pWVar2 = this->world;
  std::__cxx11::string::string
            ((string *)&subject_extra,"BoardMaxUserRecentPosts",(allocator *)&local_90);
  pmVar12 = std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&pWVar2->config,&subject_extra);
  iVar11 = util::variant::GetInt(pmVar12);
  iVar9 = iVar11 - iVar15;
  if (iVar10 - iVar8 <= iVar11 - iVar15) {
    iVar9 = iVar10 - iVar8;
  }
  std::__cxx11::string::~string((string *)&subject_extra);
  std::__cxx11::string::~string((string *)&author_extra);
  p_Var14 = (_List_node_base *)plVar13;
  while( true ) {
    p_Var14 = (((_List_base<Board_Post_*,_std::allocator<Board_Post_*>_> *)&p_Var14->_M_next)->
              _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var14 == (_List_node_base *)plVar13) break;
    puVar5 = (unsigned_short *)p_Var14[1]._M_next;
    PacketBuilder::AddShort(&builder,*puVar5);
    PacketBuilder::AddByte(&builder,0xff);
    author_extra._M_string_length = 0;
    author_extra._M_dataplus._M_p = (pointer)&author_extra.field_2;
    author_extra.field_2._M_local_buf[0] = '\0';
    if (0 < iVar9) {
      std::__cxx11::string::assign((char *)&author_extra);
    }
    std::operator+(&subject_extra,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(puVar5 + 4)
                   ,&author_extra);
    PacketBuilder::AddBreakString(&builder,&subject_extra,0xff);
    std::__cxx11::string::~string((string *)&subject_extra);
    subject_extra._M_dataplus._M_p = (pointer)&subject_extra.field_2;
    subject_extra._M_string_length = 0;
    subject_extra.field_2._M_local_buf[0] = '\0';
    pWVar2 = this->world;
    std::__cxx11::string::string((string *)&local_70,"BoardDatePosts",(allocator *)&local_90);
    this_00 = &local_70;
    pmVar12 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&pWVar2->config,&local_70);
    bVar6 = util::variant::GetBool(pmVar12);
    std::__cxx11::string::~string((string *)&local_70);
    if (bVar6) {
      dVar1 = *(double *)(puVar5 + 0x38);
      dVar16 = Timer::GetTime();
      util::timeago_abi_cxx11_(&local_50,(util *)this_00,dVar1,dVar16);
      std::operator+(&local_90," (",&local_50);
      std::operator+(&local_70,&local_90,")");
      std::__cxx11::string::operator=((string *)&subject_extra,(string *)&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
    }
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (puVar5 + 0x18),&subject_extra);
    PacketBuilder::AddBreakString(&builder,&local_70,0xff);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&subject_extra);
    std::__cxx11::string::~string((string *)&author_extra);
  }
  Send(this,&builder);
  PacketBuilder::~PacketBuilder(&builder);
  return;
}

Assistant:

void Character::ShowBoard(Board *board)
{
	if (!board)
	{
		board = this->board;
	}

	const int date_res = (this->world->config["BoardDatePosts"]) ? 17 : 0;

	PacketBuilder builder(PACKET_BOARD, PACKET_OPEN, 2 + board->posts.size() * (17 + int(this->world->config["BoardMaxSubjectLength"]) + date_res));
	builder.AddChar(board->id + 1);
	builder.AddChar(board->posts.size());

	int post_count = 0;
	int recent_post_count = 0;

	UTIL_FOREACH(board->posts, post)
	{
		if (post->author == this->player->character->SourceName())
		{
			++post_count;

			if (post->time + static_cast<int>(this->world->config["BoardRecentPostTime"]) > Timer::GetTime())
			{
				++recent_post_count;
			}
		}
	}

	int posts_remaining = std::min(static_cast<int>(this->world->config["BoardMaxUserPosts"]) - post_count, static_cast<int>(this->world->config["BoardMaxUserRecentPosts"]) - recent_post_count);

	UTIL_FOREACH(board->posts, post)
	{
		builder.AddShort(post->id);
		builder.AddByte(255);

		std::string author_extra;

		if (posts_remaining > 0)
		{
			author_extra = " ";
		}

		builder.AddBreakString(post->author + author_extra);

		std::string subject_extra;

		if (this->world->config["BoardDatePosts"])
		{
			subject_extra = " (" + util::timeago(post->time, Timer::GetTime()) + ")";
		}

		builder.AddBreakString(post->subject + subject_extra);
	}

	this->Send(builder);
}